

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void build_impute_node<InputData<float,int>&,WorkerMemory<ImputedData<int,double>,double,float>&,double>
               (ImputeNode *imputer,WorkerMemory<ImputedData<int,_double>,_double,_float> *workspace
               ,InputData<float,_int> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this;
  WeighImpRows WVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pIVar4;
  pointer pdVar5;
  double *pdVar6;
  pointer puVar7;
  bool bVar8;
  bool bVar9;
  uchar *puVar10;
  int *piVar11;
  ulong uVar12;
  ulong *puVar13;
  double *cat;
  double *pdVar14;
  ulong *key;
  size_t sVar15;
  ImputeNode *pIVar16;
  pointer pvVar17;
  long lVar18;
  size_t sVar19;
  ulong uVar20;
  size_t sVar21;
  size_t col_1;
  ulong uVar22;
  ulong uVar23;
  size_t col;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  int *piVar27;
  size_t sVar28;
  long lVar29;
  undefined4 uVar30;
  int iVar37;
  double dVar31;
  float *pfVar32;
  double dVar33;
  undefined4 uVar38;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float *pfVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  pointer puVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar51;
  double dVar49;
  undefined1 auVar50 [16];
  double dVar52;
  undefined1 auVar53 [16];
  double dVar54;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar55;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> *__range3_1;
  size_t ix;
  double __tmp;
  tuple<> local_b1;
  ImputeNode *local_b0;
  float *local_a8;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_a0;
  pointer local_98;
  double local_90;
  vector<double,_std::allocator<double>_> *local_88;
  vector<double,_std::allocator<double>_> *local_80;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_78;
  unsigned_long local_70;
  undefined1 local_68 [16];
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_50;
  size_t local_48;
  ModelParams *local_40;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_38;
  
  bVar8 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  bVar9 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_90 = (double)CONCAT71(local_90._1_7_,!bVar8 || !bVar9);
  local_b0 = imputer;
  local_50 = imputer_tree;
  local_48 = curr_depth;
  local_40 = model_params;
  if (bVar8 && bVar9) {
    lVar25 = (workspace->end - workspace->st) + 1;
    auVar34._8_4_ = (int)((ulong)lVar25 >> 0x20);
    auVar34._0_8_ = lVar25;
    auVar34._12_4_ = 0x45300000;
    dVar33 = auVar34._8_8_ - 1.9342813113834067e+25;
    local_68._0_8_ = dVar33 + ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
    local_68._8_8_ = dVar33;
  }
  else {
    local_68._0_8_ =
         calculate_sum_weights<double>
                   (&workspace->ix_arr,workspace->st,workspace->end,curr_depth,
                    &workspace->weights_arr,&workspace->weights_map);
    local_68._8_8_ = extraout_XMM0_Qb;
  }
  pIVar16 = local_b0;
  local_a0._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_b0->num_sum,input_data->ncols_numeric,(value_type_conflict *)&local_a0);
  local_88 = &pIVar16->num_weight;
  local_a0._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_88,input_data->ncols_numeric,(value_type_conflict *)&local_a0);
  this = &pIVar16->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this,input_data->ncols_categ);
  local_80 = &pIVar16->cat_weight;
  local_a0._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_80,input_data->ncols_categ,(value_type_conflict *)&local_a0);
  if ((pIVar16->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar16->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
              (&pIVar16->num_sum);
  }
  if ((pIVar16->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar16->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_88)
    ;
  }
  if ((pIVar16->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pIVar16->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
    ::_S_do_it(this);
  }
  if ((pIVar16->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar16->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_80)
    ;
  }
  if (input_data->ncols_categ == 0) {
    uVar12 = 0;
  }
  else {
    lVar25 = 0;
    uVar26 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar25),(long)input_data->ncat[uVar26]);
      pvVar17 = (this->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar25 + 0x10) !=
          *(long *)((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar25 + 8)) {
        std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar25));
      }
      uVar26 = uVar26 + 1;
      uVar12 = input_data->ncols_categ;
      lVar25 = lVar25 + 0x18;
    } while (uVar26 < uVar12);
  }
  auVar34 = _DAT_0036e1d0;
  uVar26 = input_data->ncols_numeric;
  dVar33 = (double)local_68._0_8_;
  if ((uVar12 != 0) || (input_data->Xc_indptr == (int *)0x0 && uVar26 != 0)) {
    local_a8 = input_data->numeric_data;
    if (local_90._0_1_ == '\0') {
      if (uVar26 != 0 && local_a8 != (float *)0x0) {
        puVar7 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar22 = workspace->st;
        uVar24 = workspace->end;
        sVar15 = input_data->nrows;
        pdVar2 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar23 = 0;
        do {
          dVar31 = 0.0;
          if (uVar22 <= uVar24) {
            pdVar3 = (local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
            lVar25 = 0;
            uVar20 = uVar22;
            do {
              dVar49 = (double)local_a8[sVar15 * uVar23 + puVar7[uVar20]];
              uVar30 = SUB164(ZEXT816(0x4530000043300000),0);
              uVar38 = SUB164(ZEXT816(0x4530000043300000),4);
              dVar31 = auVar34._0_8_;
              dVar52 = auVar34._8_8_;
              if (ABS(dVar49) != INFINITY && !NAN(local_a8[sVar15 * uVar23 + puVar7[uVar20]])) {
                lVar25 = lVar25 + 1;
                dVar54 = pdVar3[uVar23];
                auVar47._8_4_ = (int)((ulong)lVar25 >> 0x20);
                auVar47._0_8_ = lVar25;
                auVar47._12_4_ = uVar38;
                pdVar3[uVar23] =
                     (dVar49 - dVar54) /
                     ((auVar47._8_8_ - dVar52) + ((double)CONCAT44(uVar30,(int)lVar25) - dVar31)) +
                     dVar54;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 <= uVar24);
            auVar46._8_4_ = (int)((ulong)lVar25 >> 0x20);
            auVar46._0_8_ = lVar25;
            auVar46._12_4_ = uVar38;
            dVar31 = (auVar46._8_8_ - dVar52) + ((double)CONCAT44(uVar30,(int)lVar25) - dVar31);
          }
          pdVar2[uVar23] = dVar31;
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar26);
      }
      piVar11 = input_data->categ_data;
      if (uVar12 != 0 && piVar11 != (int *)0x0) {
        puVar7 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar26 = workspace->st;
        uVar22 = workspace->end;
        sVar15 = input_data->nrows;
        pdVar2 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar24 = 0;
        dVar31 = (double)DAT_0036e1d0;
        dVar52 = DAT_0036e1d0._8_8_;
        do {
          dVar49 = 0.0;
          if (uVar26 <= uVar22) {
            pvVar17 = (this->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar25 = 0;
            uVar23 = uVar26;
            do {
              lVar29 = (long)piVar11[sVar15 * uVar24 + puVar7[uVar23]];
              if (-1 < lVar29) {
                lVar25 = lVar25 + 1;
                lVar18 = *(long *)&pvVar17[uVar24].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                *(double *)(lVar18 + lVar29 * 8) = *(double *)(lVar18 + lVar29 * 8) + 1.0;
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 <= uVar22);
            auVar48._8_4_ = (int)((ulong)lVar25 >> 0x20);
            auVar48._0_8_ = lVar25;
            auVar48._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar49 = (auVar48._8_8_ - dVar52) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar25) - dVar31);
          }
          pdVar2[uVar24] = dVar49;
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar12);
      }
    }
    else {
      if (uVar26 != 0 && local_a8 != (float *)0x0) {
        local_78 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                    *)&workspace->weights_map;
        uVar12 = workspace->end;
        uVar22 = 0;
        pIVar16 = local_b0;
        do {
          uVar24 = workspace->st;
          pfVar32 = (float *)0x0;
          if (uVar24 <= uVar12) {
            lVar25 = uVar24 * 8;
            auVar43 = ZEXT816(0);
            do {
              puVar7 = (workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar29 = *(long *)((long)puVar7 + lVar25);
              puVar44 = (pointer)(double)input_data->numeric_data
                                         [lVar29 + input_data->nrows * uVar22];
              if (ABS((double)puVar44) != INFINITY &&
                  !NAN(input_data->numeric_data[lVar29 + input_data->nrows * uVar22])) {
                pdVar2 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar2) {
                  local_a0._M_head_impl = (unsigned_long *)((long)puVar7 + lVar25);
                  local_a8 = pfVar32;
                  local_98 = puVar44;
                  local_90 = auVar43._0_8_;
                  pVar55 = tsl::detail_robin_hash::
                           robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           ::
                           insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                     (local_78,local_a0._M_head_impl,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<const_unsigned_long_&> *)&local_a0,(tuple<> *)&local_70
                                     );
                  puVar10 = (pVar55.first.m_bucket.m_bucket)->m_value + 8;
                  uVar12 = workspace->end;
                  dVar33 = (double)local_68._0_8_;
                  dVar31 = local_90;
                  pfVar39 = local_a8;
                  puVar44 = local_98;
                }
                else {
                  puVar10 = (uchar *)(pdVar2 + lVar29);
                  dVar31 = auVar43._0_8_;
                  pfVar39 = pfVar32;
                }
                dVar52 = *(double *)puVar10;
                pdVar2 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar2[uVar22] = dVar52 + pdVar2[uVar22];
                dVar31 = (double)puVar44 * dVar52 - dVar31;
                pfVar32 = (float *)((double)pfVar39 + dVar31);
                auVar43._0_8_ = ((double)pfVar32 - (double)pfVar39) - dVar31;
                auVar43._8_8_ = 0;
              }
              uVar24 = uVar24 + 1;
              lVar25 = lVar25 + 8;
            } while (uVar24 <= uVar12);
            uVar26 = input_data->ncols_numeric;
            pIVar16 = local_b0;
          }
          (pIVar16->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22] =
               (double)pfVar32 /
               (pIVar16->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar22 < uVar26);
        uVar12 = input_data->ncols_categ;
      }
      if ((uVar12 != 0) && (uVar26 = workspace->st, uVar26 <= workspace->end)) {
        do {
          local_70 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar26];
          pdVar2 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar2) {
            local_a0._M_head_impl = &local_70;
            pVar55 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&local_70,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a0,&local_b1);
            puVar10 = (pVar55.first.m_bucket.m_bucket)->m_value + 8;
            uVar12 = input_data->ncols_categ;
            dVar33 = (double)local_68._0_8_;
          }
          else {
            puVar10 = (uchar *)(pdVar2 + local_70);
          }
          if (uVar12 != 0) {
            dVar31 = *(double *)puVar10;
            sVar15 = input_data->nrows;
            piVar11 = input_data->categ_data + local_70;
            pvVar17 = (this->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pdVar2 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar22 = 0;
            do {
              lVar25 = (long)*piVar11;
              if (-1 < lVar25) {
                lVar29 = *(long *)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data;
                *(double *)(lVar29 + lVar25 * 8) = *(double *)(lVar29 + lVar25 * 8) + dVar31;
                pdVar2[uVar22] = pdVar2[uVar22] + dVar31;
              }
              uVar22 = uVar22 + 1;
              piVar11 = piVar11 + sVar15;
              pvVar17 = pvVar17 + 1;
            } while (uVar12 != uVar22);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 <= workspace->end);
      }
    }
  }
  auVar47 = _DAT_0036e1f0;
  auVar34 = _DAT_0036e1e0;
  if (input_data->Xc_indptr != (int *)0x0) {
    local_98 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pdVar2 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar2 != pdVar3) {
      uVar12 = (long)pdVar3 + (-8 - (long)pdVar2);
      auVar35._8_4_ = (int)uVar12;
      auVar35._0_8_ = uVar12;
      auVar35._12_4_ = (int)(uVar12 >> 0x20);
      auVar36._0_8_ = uVar12 >> 3;
      auVar36._8_8_ = auVar35._8_8_ >> 3;
      uVar26 = 0;
      auVar36 = auVar36 ^ _DAT_0036e1f0;
      do {
        auVar45._8_4_ = (int)uVar26;
        auVar45._0_8_ = uVar26;
        auVar45._12_4_ = (int)(uVar26 >> 0x20);
        auVar46 = (auVar45 | auVar34) ^ auVar47;
        bVar8 = auVar36._0_4_ < auVar46._0_4_;
        iVar37 = auVar36._4_4_;
        iVar51 = auVar46._4_4_;
        if ((bool)(~(iVar37 < iVar51 || iVar51 == iVar37 && bVar8) & 1)) {
          pdVar2[uVar26] = dVar33;
        }
        if (iVar37 >= iVar51 && (iVar51 != iVar37 || !bVar8)) {
          pdVar2[uVar26 + 1] = dVar33;
        }
        uVar26 = uVar26 + 2;
      } while (((uVar12 >> 3) + 2 & 0xfffffffffffffffe) != uVar26);
    }
    sVar15 = input_data->ncols_numeric;
    if (sVar15 != 0) {
      local_a8 = (float *)(local_98 + 1);
      local_38 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                  *)&workspace->weights_map;
      sVar19 = workspace->end;
      uVar12 = 0;
      do {
        piVar11 = input_data->Xc_ind;
        lVar25 = (long)input_data->Xc_indptr[uVar12];
        key = local_98 + workspace->st;
        puVar13 = (ulong *)((long)local_a8 + sVar19 * 8);
        uVar26 = (long)puVar13 - (long)key >> 3;
        if (0 < (long)uVar26) {
          do {
            uVar22 = uVar26 >> 1;
            uVar24 = ~uVar22 + uVar26;
            uVar26 = uVar22;
            if ((key + uVar22 + 1)[-1] < (ulong)(long)piVar11[lVar25]) {
              key = key + uVar22 + 1;
              uVar26 = uVar24;
            }
          } while (0 < (long)uVar26);
        }
        if (key != puVar13) {
          lVar18 = (long)input_data->Xc_indptr[uVar12 + 1];
          lVar29 = lVar18 + -1;
          if (lVar18 != lVar25) {
            local_90 = (double)(long)piVar11[lVar18 + -1];
            uVar26 = *key;
            if (uVar26 <= (ulong)local_90) {
              do {
                iVar37 = piVar11[lVar25];
                if (iVar37 == (int)uVar26) {
                  fVar42 = input_data->Xc[lVar25];
                  pdVar2 = (workspace->weights_arr).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish == pdVar2) {
                    dVar31 = 1.0;
                    if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
                      local_78 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                  *)CONCAT44(local_78._4_4_,fVar42);
                      local_a0._M_head_impl = key;
                      pVar55 = tsl::detail_robin_hash::
                               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               ::
                               insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                         (local_38,key,
                                          (piecewise_construct_t *)&std::piecewise_construct,
                                          (tuple<const_unsigned_long_&> *)&local_a0,&local_b1);
                      puVar10 = (pVar55.first.m_bucket.m_bucket)->m_value + 8;
                      dVar33 = (double)local_68._0_8_;
                      fVar42 = local_78._0_4_;
                      goto LAB_00263a27;
                    }
                  }
                  else {
                    puVar10 = (uchar *)(pdVar2 + uVar26);
LAB_00263a27:
                    dVar31 = *(double *)puVar10;
                  }
                  if (ABS((double)fVar42) == INFINITY || NAN(fVar42)) {
                    pdVar2 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                             .super__Vector_impl_data._M_start;
                    pdVar2[uVar12] = pdVar2[uVar12] - dVar31;
                  }
                  else {
                    pdVar2 = (local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pdVar2[uVar12] = dVar31 * (double)fVar42 + pdVar2[uVar12];
                  }
                  sVar19 = workspace->end;
                  if ((key == local_98 + sVar19) || (lVar25 == lVar29)) break;
                  piVar11 = input_data->Xc_ind;
                  piVar27 = piVar11 + lVar25;
                  key = key + 1;
                  uVar26 = (long)piVar11 + (lVar29 * 4 - (long)piVar27) + 4 >> 2;
                  if (0 < (long)uVar26) {
                    do {
                      uVar22 = uVar26 >> 1;
                      uVar24 = ~uVar22 + uVar26;
                      uVar26 = uVar22;
                      if ((ulong)(long)(piVar27 + uVar22 + 1)[-1] < *key) {
                        piVar27 = piVar27 + uVar22 + 1;
                        uVar26 = uVar24;
                      }
                    } while (0 < (long)uVar26);
                  }
LAB_00263af8:
                  lVar25 = (long)piVar27 - (long)piVar11 >> 2;
                }
                else {
                  if (iVar37 <= (int)uVar26) {
                    piVar27 = piVar11 + lVar25 + 1;
                    uVar22 = (long)piVar11 + (lVar29 * 4 - (long)(piVar11 + lVar25 + 1)) + 4 >> 2;
                    while (0 < (long)uVar22) {
                      uVar24 = uVar22 >> 1;
                      uVar23 = ~uVar24 + uVar22;
                      uVar22 = uVar24;
                      if ((ulong)(long)(piVar27 + uVar24 + 1)[-1] < uVar26) {
                        piVar27 = piVar27 + uVar24 + 1;
                        uVar22 = uVar23;
                      }
                    }
                    goto LAB_00263af8;
                  }
                  key = key + 1;
                  uVar26 = (long)puVar13 - (long)key >> 3;
                  while (0 < (long)uVar26) {
                    uVar22 = uVar26 >> 1;
                    uVar24 = ~uVar22 + uVar26;
                    uVar26 = uVar22;
                    if ((key + uVar22 + 1)[-1] < (ulong)(long)iVar37) {
                      key = key + uVar22 + 1;
                      uVar26 = uVar24;
                    }
                  }
                }
                puVar13 = (ulong *)((long)local_a8 + sVar19 * 8);
                if (((key == puVar13) || (lVar25 == lVar18)) ||
                   (uVar26 = *key, (ulong)local_90 < uVar26)) break;
              } while( true );
            }
            sVar15 = input_data->ncols_numeric;
          }
        }
        pdVar2 = (local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2[uVar12] =
             pdVar2[uVar12] /
             (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar12 < sVar15);
    }
  }
  auVar40._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
  auVar40._8_4_ = (int)(min_imp_obs >> 0x20);
  auVar40._12_4_ = 0x45300000;
  dVar31 = (auVar40._8_8_ - 1.9342813113834067e+25) + (auVar40._0_8_ - 4503599627370496.0);
  pdVar2 = (local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((local_b0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish != pdVar2) &&
     (sVar15 = input_data->ncols_numeric, sVar15 != 0)) {
    pdVar3 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar19 = local_b0->parent;
    pIVar4 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar21 = 0;
    do {
      pdVar14 = pdVar3 + sVar21;
      if (*pdVar14 <= dVar31 && dVar31 != *pdVar14) {
        dVar52 = *(double *)
                  (*(long *)&pIVar4[sVar19].num_sum.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  sVar21 * 8);
        dVar49 = 2.0;
        sVar28 = sVar19;
        if (0x7fefffffffffffff < (ulong)ABS(dVar52)) {
          lVar25 = 2;
          do {
            if (sVar28 == 0) {
              pdVar2[sVar21] = NAN;
              dVar49 = 0.0;
              goto LAB_00263c94;
            }
            sVar28 = pIVar4[sVar28].parent;
            dVar52 = *(double *)
                      (*(long *)&pIVar4[sVar28].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar21 * 8);
            lVar25 = lVar25 + 2;
          } while (0x7fefffffffffffff < (ulong)ABS(dVar52));
          auVar53._8_4_ = (int)((ulong)lVar25 >> 0x20);
          auVar53._0_8_ = lVar25;
          auVar53._12_4_ = 0x45300000;
          dVar49 = (auVar53._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
        }
        pdVar2[sVar21] =
             dVar52 / *(double *)
                       (*(long *)&pIVar4[sVar28].num_weight.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       sVar21 * 8);
        dVar49 = dVar33 / dVar49;
LAB_00263c94:
        pdVar3[sVar21] = dVar49;
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != sVar15);
  }
  pvVar17 = (local_b0->cat_sum).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((local_b0->cat_sum).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != pvVar17) &&
     (sVar15 = input_data->ncols_categ, sVar15 != 0)) {
    pdVar3 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar19 = local_b0->parent;
    pIVar4 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar11 = input_data->ncat;
    sVar21 = 0;
    do {
      if (dVar31 <= pdVar3[sVar21]) {
        pdVar6 = pvVar17[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar14 = pvVar17[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar14 != pdVar6; pdVar14 = pdVar14 + 1) {
          *pdVar14 = *pdVar14 / pdVar3[sVar21];
        }
      }
      else {
        lVar25 = *(long *)&pIVar4[sVar19].cat_weight.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        dVar52 = 2.0;
        sVar28 = sVar19;
        if (*(double *)(lVar25 + sVar21 * 8) <= 0.0) {
          lVar29 = 2;
          do {
            if (sVar28 == 0) goto LAB_00263de2;
            sVar28 = pIVar4[sVar28].parent;
            lVar25 = *(long *)&pIVar4[sVar28].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            lVar29 = lVar29 + 2;
          } while (*(double *)(lVar25 + sVar21 * 8) <= 0.0);
          auVar50._8_4_ = (int)((ulong)lVar29 >> 0x20);
          auVar50._0_8_ = lVar29;
          auVar50._12_4_ = 0x45300000;
          dVar52 = (auVar50._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar29) - 4503599627370496.0);
        }
        iVar37 = piVar11[sVar21];
        if (0 < (long)iVar37) {
          lVar29 = *(long *)(*(long *)&pIVar4[sVar28].cat_sum.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl + sVar21 * 0x18);
          pdVar5 = pvVar17[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar18 = 0;
          do {
            dVar49 = *(double *)(lVar29 + lVar18 * 8);
            dVar54 = 0.0;
            if (0.0 < dVar49) {
              dVar54 = dVar49 / *(double *)(lVar25 + sVar21 * 8);
            }
            pdVar5[lVar18] = dVar54 + pdVar5[lVar18];
            pdVar3[sVar21] = dVar33 / dVar52;
            lVar18 = lVar18 + 1;
          } while (iVar37 != lVar18);
        }
LAB_00263de2:
        dVar52 = 0.0;
        for (pdVar14 = pvVar17[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar14 !=
            pvVar17[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar14 = pdVar14 + 1) {
          dVar52 = dVar52 + *pdVar14;
        }
        pdVar3[sVar21] = dVar52;
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != sVar15);
  }
  WVar1 = local_40->weigh_imp_rows;
  if (WVar1 == Flat) {
    pdVar6 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar14 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar14 != pdVar6;
        pdVar14 = pdVar14 + 1) {
      *pdVar14 = *pdVar14 / dVar33;
    }
    pdVar6 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar14 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar14 != pdVar6;
        pdVar14 = pdVar14 + 1) {
      *pdVar14 = *pdVar14 / dVar33;
    }
  }
  else if (WVar1 == Inverse) {
    pdVar6 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar14 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar14 != pdVar6;
        pdVar14 = pdVar14 + 1) {
      *pdVar14 = *pdVar14 / (SQRT(dVar33) * dVar33);
    }
    pdVar6 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar14 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar14 != pdVar6;
        pdVar14 = pdVar14 + 1) {
      *pdVar14 = *pdVar14 / (SQRT(dVar33) * dVar33);
    }
  }
  lVar25 = local_48 + 1;
  auVar41._8_4_ = (int)((ulong)lVar25 >> 0x20);
  auVar41._0_8_ = lVar25;
  auVar41._12_4_ = 0x45300000;
  dVar33 = (auVar41._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
  if (local_40->depth_imp == Higher) {
    pdVar6 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar14 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar14 != pdVar6;
        pdVar14 = pdVar14 + 1) {
      *pdVar14 = *pdVar14 * dVar33;
    }
    pdVar6 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar14 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar14 != pdVar6;
        pdVar14 = pdVar14 + 1) {
      *pdVar14 = *pdVar14 * dVar33;
    }
  }
  else if (local_40->depth_imp == Lower) {
    pdVar6 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar14 = (local_b0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar14 != pdVar6;
        pdVar14 = pdVar14 + 1) {
      *pdVar14 = *pdVar14 / dVar33;
    }
    pdVar6 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar14 = (local_b0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar14 != pdVar6;
        pdVar14 = pdVar14 + 1) {
      *pdVar14 = *pdVar14 / dVar33;
    }
  }
  if ((WVar1 != Prop) || (local_40->depth_imp != Same)) {
    sVar15 = input_data->ncols_numeric;
    if (sVar15 != 0) {
      pdVar3 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar19 = 0;
      do {
        pdVar2[sVar19] = pdVar3[sVar19] * pdVar2[sVar19];
        sVar19 = sVar19 + 1;
      } while (sVar15 != sVar19);
    }
    sVar15 = input_data->ncols_categ;
    if (sVar15 != 0) {
      piVar11 = input_data->ncat;
      pdVar2 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar19 = 0;
      do {
        iVar37 = piVar11[sVar19];
        if (0 < (long)iVar37) {
          pdVar3 = pvVar17[sVar19].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar25 = 0;
          do {
            pdVar3[lVar25] = pdVar2[sVar19] * pdVar3[lVar25];
            lVar25 = lVar25 + 1;
          } while (iVar37 != lVar25);
        }
        sVar19 = sVar19 + 1;
      } while (sVar19 != sVar15);
    }
  }
  return;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}